

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  _Rb_tree_header *p_Var1;
  cmCPackComponentGroup *pcVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  _Base_ptr p_Var7;
  size_type *psVar8;
  long *plVar9;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string prefix;
  string local_b0;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined1 uStack_78;
  undefined4 uStack_77;
  undefined2 uStack_73;
  char cStack_71;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_90 = &local_80;
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  local_80 = '\0';
  if (component == (cmCPackComponent *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_78,uStack_7f);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_77;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_73;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_71;
    __return_storage_ptr__->_M_string_length = 0;
    local_80 = '\0';
    goto LAB_001842b0;
  }
  p_Var7 = (this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(cmCPackComponent **)(p_Var7 + 1) >= component) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(cmCPackComponent **)(p_Var7 + 1) < component];
    } while (p_Var7 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var5 != p_Var1) && (*(cmCPackComponent **)(p_Var5 + 1) <= component))
       && (p_Var7 = p_Var5[1]._M_parent, p_Var7 != (_Base_ptr)0x0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var7[5]._M_parent,
                 (long)&(p_Var7[5]._M_parent)->_M_color + (long)&(p_Var7[5]._M_left)->_M_color);
      goto LAB_001842b0;
    }
  }
  cmsys::SystemTools::UpperCase(&local_70,&component->Name);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x6cc17a);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_50 = &local_40;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar6[3];
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*plVar6;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_48 + (long)local_50);
  std::__cxx11::string::append((char *)&local_b0);
  cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign((string *)&local_90);
  pcVar2 = component->Group;
  if (pcVar2 == (cmCPackComponentGroup *)0x0) {
LAB_00184249:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_90 == &local_80) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(cStack_71,CONCAT25(uStack_73,CONCAT41(uStack_77,uStack_78)));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_90;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_88;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    local_80 = '\0';
    local_90 = &local_80;
  }
  else {
    p_Var7 = (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 == (_Base_ptr)0x0) {
LAB_00184099:
      p_Var7 = (_Base_ptr)0x0;
    }
    else {
      p_Var1 = &(this->GroupPackages)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (*(cmCPackComponentGroup **)(p_Var7 + 1) >= pcVar2) {
          p_Var5 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[*(cmCPackComponentGroup **)(p_Var7 + 1) < pcVar2];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
         (pcVar2 < *(cmCPackComponentGroup **)(p_Var5 + 1))) goto LAB_00184099;
      p_Var7 = p_Var5[1]._M_parent;
    }
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_50,local_48 + (long)local_50);
      std::__cxx11::string::append((char *)&local_b0);
      bVar3 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        if (this->ResolveDuplicateNames == false) {
          local_b0._M_dataplus._M_p = (pointer)local_88;
          local_b0._M_string_length = (size_type)local_90;
          __str._M_str = (char *)p_Var7[5]._M_parent;
          __str._M_len = (size_t)p_Var7[5]._M_left;
          iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_b0,0,
                             (size_type)p_Var7[5]._M_left,__str);
          if (iVar4 != 0) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,p_Var7[5]._M_parent,
                       (long)&(p_Var7[5]._M_parent)->_M_color + (long)&(p_Var7[5]._M_left)->_M_color
                      );
            std::__cxx11::string::append((char *)&local_70);
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
            psVar8 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar8) {
              local_b0.field_2._M_allocated_capacity = *psVar8;
              local_b0.field_2._8_8_ = plVar6[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar8;
              local_b0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_b0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
        }
        goto LAB_00184249;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var7[5]._M_parent,
               (long)&(p_Var7[5]._M_parent)->_M_color + (long)&(p_Var7[5]._M_left)->_M_color);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
LAB_001842b0:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent* component) const
{
  std::string name;
  if (!component) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetComponentPackage(component)) {
    return package->Name;
  }
  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";
  cmValue option = this->GetOption(prefix + "NAME");
  name = option ? *option : component->Name;
  if (component->Group) {
    cmCPackIFWPackage* package = this->GetGroupPackage(component->Group);
    if ((this->componentPackageMethod ==
         cmCPackGenerator::ONE_PACKAGE_PER_GROUP) ||
        this->IsOn(prefix + "COMMON")) {
      return package->Name;
    }
    bool dot = !this->ResolveDuplicateNames;
    if (dot && !cmHasPrefix(name, package->Name)) {
      name = package->Name + "." + name;
    }
  }
  return name;
}